

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DebugScope::ToBinary
          (DebugScope *this,uint32_t type_id,uint32_t result_id,uint32_t ext_set,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  initializer_list<unsigned_int> __l;
  uint32_t uVar1;
  uint32_t local_a0;
  uint32_t local_9c;
  uint *local_98;
  uint *local_90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  const_iterator local_78;
  allocator<unsigned_int> local_6d;
  uint local_6c;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t local_60;
  undefined4 local_5c;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  CommonDebugInfoInstructions dbg_opcode;
  uint32_t num_words;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binary_local;
  uint32_t ext_set_local;
  uint32_t result_id_local;
  uint32_t type_id_local;
  DebugScope *this_local;
  
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x17;
  uVar1 = GetLexicalScope(this);
  if (uVar1 == 0) {
    operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x18;
  }
  else {
    uVar1 = GetInlinedAt(this);
    if (uVar1 == 0) {
      operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 6;
    }
  }
  local_6c = operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ << 0x10 | 0xc;
  local_5c = operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_;
  local_58 = &local_6c;
  local_50 = 5;
  local_68 = type_id;
  local_64 = result_id;
  local_60 = ext_set;
  std::allocator<unsigned_int>::allocator(&local_6d);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,__l,&local_6d);
  std::allocator<unsigned_int>::~allocator(&local_6d);
  local_80._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(binary);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_78,&local_80);
  local_88._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  local_90 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  local_98 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                     insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                               ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,local_78
                                ,local_88,
                                (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 )local_90);
  uVar1 = GetLexicalScope(this);
  if (uVar1 != 0) {
    local_9c = GetLexicalScope(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(binary,&local_9c);
    uVar1 = GetInlinedAt(this);
    if (uVar1 != 0) {
      local_a0 = GetInlinedAt(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(binary,&local_a0);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void DebugScope::ToBinary(uint32_t type_id, uint32_t result_id,
                          uint32_t ext_set,
                          std::vector<uint32_t>* binary) const {
  uint32_t num_words = kDebugScopeNumWords;
  CommonDebugInfoInstructions dbg_opcode = CommonDebugInfoDebugScope;
  if (GetLexicalScope() == kNoDebugScope) {
    num_words = kDebugNoScopeNumWords;
    dbg_opcode = CommonDebugInfoDebugNoScope;
  } else if (GetInlinedAt() == kNoInlinedAt) {
    num_words = kDebugScopeNumWordsWithoutInlinedAt;
  }
  std::vector<uint32_t> operands = {
      (num_words << 16) | static_cast<uint16_t>(spv::Op::OpExtInst),
      type_id,
      result_id,
      ext_set,
      static_cast<uint32_t>(dbg_opcode),
  };
  binary->insert(binary->end(), operands.begin(), operands.end());
  if (GetLexicalScope() != kNoDebugScope) {
    binary->push_back(GetLexicalScope());
    if (GetInlinedAt() != kNoInlinedAt) binary->push_back(GetInlinedAt());
  }
}